

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O2

void __thiscall MT32Emu::Part::setPan(Part *this,uint midiPan)

{
  ulong uStack_8;
  
  if (((uint)*this->synth->controlROMFeatures & 0x10) == 0) {
    midiPan = midiPan << 3;
    uStack_8 = 0x44;
  }
  else {
    uStack_8 = 9;
  }
  this->patchTemp->panpot = (Bit8u)(midiPan / uStack_8);
  return;
}

Assistant:

void Part::setPan(unsigned int midiPan) {
	// NOTE: Panning is inverted compared to GM.

	if (synth->controlROMFeatures->quirkPanMult) {
		// MT-32: Divide by 9
		patchTemp->panpot = Bit8u(midiPan / 9);
	} else {
		// CM-32L: Divide by 8.5
		patchTemp->panpot = Bit8u((midiPan << 3) / 68);
	}

	//synth->printDebug("%s (%s): Set pan to %d", name, currentInstr, panpot);
}